

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O2

void proto3_arena_unittest::TestUnpackedTypes::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  Nullable<const_char_*> failure_msg;
  TestUnpackedTypes *_this;
  TestUnpackedTypes *local_20;
  MessageLite *local_18 [2];
  
  local_20 = (TestUnpackedTypes *)to_msg;
  local_18[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto3_arena_unittest::TestUnpackedTypes_const*,proto3_arena_unittest::TestUnpackedTypes*>
                          ((TestUnpackedTypes **)local_18,&local_20,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    google::protobuf::RepeatedField<int>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_int32_,(RepeatedField<int> *)(from_msg + 1));
    google::protobuf::RepeatedField<long>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_int64_,(RepeatedField<long> *)(from_msg + 2));
    google::protobuf::RepeatedField<unsigned_int>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_uint32_,
               (RepeatedField<unsigned_int> *)(from_msg + 3));
    google::protobuf::RepeatedField<unsigned_long>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_uint64_,
               (RepeatedField<unsigned_long> *)(from_msg + 4));
    google::protobuf::RepeatedField<int>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_sint32_,(RepeatedField<int> *)(from_msg + 5));
    google::protobuf::RepeatedField<long>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_sint64_,(RepeatedField<long> *)(from_msg + 6));
    google::protobuf::RepeatedField<unsigned_int>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_fixed32_,
               (RepeatedField<unsigned_int> *)(from_msg + 7));
    google::protobuf::RepeatedField<unsigned_long>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_fixed64_,
               (RepeatedField<unsigned_long> *)(from_msg + 8));
    google::protobuf::RepeatedField<int>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_sfixed32_,(RepeatedField<int> *)(from_msg + 9));
    google::protobuf::RepeatedField<long>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_sfixed64_,(RepeatedField<long> *)(from_msg + 10)
              );
    google::protobuf::RepeatedField<float>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_float_,(RepeatedField<float> *)(from_msg + 0xb))
    ;
    google::protobuf::RepeatedField<double>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_double_,
               (RepeatedField<double> *)(from_msg + 0xc));
    google::protobuf::RepeatedField<bool>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_bool_,(RepeatedField<bool> *)(from_msg + 0xd));
    google::protobuf::RepeatedField<int>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_nested_enum_,
               (RepeatedField<int> *)(from_msg + 0xe));
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_20->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_proto3_arena.pb.cc"
             ,0x1190,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18);
}

Assistant:

void TestUnpackedTypes::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestUnpackedTypes*>(&to_msg);
  auto& from = static_cast<const TestUnpackedTypes&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_arena_unittest.TestUnpackedTypes)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_int32()->MergeFrom(from._internal_repeated_int32());
  _this->_internal_mutable_repeated_int64()->MergeFrom(from._internal_repeated_int64());
  _this->_internal_mutable_repeated_uint32()->MergeFrom(from._internal_repeated_uint32());
  _this->_internal_mutable_repeated_uint64()->MergeFrom(from._internal_repeated_uint64());
  _this->_internal_mutable_repeated_sint32()->MergeFrom(from._internal_repeated_sint32());
  _this->_internal_mutable_repeated_sint64()->MergeFrom(from._internal_repeated_sint64());
  _this->_internal_mutable_repeated_fixed32()->MergeFrom(from._internal_repeated_fixed32());
  _this->_internal_mutable_repeated_fixed64()->MergeFrom(from._internal_repeated_fixed64());
  _this->_internal_mutable_repeated_sfixed32()->MergeFrom(from._internal_repeated_sfixed32());
  _this->_internal_mutable_repeated_sfixed64()->MergeFrom(from._internal_repeated_sfixed64());
  _this->_internal_mutable_repeated_float()->MergeFrom(from._internal_repeated_float());
  _this->_internal_mutable_repeated_double()->MergeFrom(from._internal_repeated_double());
  _this->_internal_mutable_repeated_bool()->MergeFrom(from._internal_repeated_bool());
  _this->_internal_mutable_repeated_nested_enum()->MergeFrom(from._internal_repeated_nested_enum());
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}